

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O2

void array_quantile_float(t_array_rangeop *x,t_floatarg f)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  bool bVar6;
  float fVar7;
  int nitem;
  int stride;
  char *firstitem;
  int arrayonset;
  
  iVar2 = array_rangeop_getrange(x,&firstitem,&nitem,&stride,&arrayonset);
  if (iVar2 == 0) {
    return;
  }
  iVar2 = 0;
  if (0 < nitem) {
    iVar2 = nitem;
  }
  fVar1 = 0.0;
  pfVar5 = (float *)firstitem;
  while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
    fVar7 = *pfVar5;
    if (fVar7 <= 0.0) {
      fVar7 = 0.0;
    }
    fVar1 = fVar1 + fVar7;
    pfVar5 = (float *)((long)pfVar5 + (long)stride);
  }
  fVar1 = fVar1 * f;
  iVar2 = 1;
  if (1 < nitem) {
    iVar2 = nitem;
  }
  for (iVar4 = 0; iVar3 = iVar2 + -1, iVar2 + -1 != iVar4; iVar4 = iVar4 + 1) {
    fVar7 = *(float *)firstitem;
    if (fVar7 <= 0.0) {
      fVar7 = 0.0;
    }
    fVar1 = fVar1 - fVar7;
    iVar3 = iVar4;
    if (fVar1 < 0.0) break;
    firstitem = (char *)((long)firstitem + (long)stride);
  }
  outlet_float((x->x_tc).tc_obj.te_outlet,(float)iVar3);
  return;
}

Assistant:

static void array_quantile_float(t_array_rangeop *x, t_floatarg f)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    double sum;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    for (i = 0, sum = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        sum += (*(t_float *)itemp > 0? *(t_float *)itemp : 0);
    sum *= f;
    for (i = 0, itemp = firstitem; i < (nitem-1); i++, itemp += stride)
    {
        sum -= (*(t_float *)itemp > 0? *(t_float *)itemp : 0);
        if (sum < 0)
            break;
    }
    outlet_float(x->x_outlet, i);
}